

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O3

string * __thiscall
glcts::AdvancedUsageSwitchPrograms::GenVSSrc_abi_cxx11_
          (string *__return_storage_ptr__,AdvancedUsageSwitchPrograms *this,int binding,int offset)

{
  ostream *poVar1;
  ostringstream os;
  undefined1 auStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_198,
             "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nflat out uvec4 o_atomic_value;\nlayout(binding = "
             ,0x67);
  poVar1 = (ostream *)std::ostream::operator<<(auStack_198,binding);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", offset = ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,offset);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             ") uniform atomic_uint ac_counter_vs;\nvoid main() {\n  gl_Position = i_vertex;\n  o_atomic_value = uvec4(atomicCounterIncrement(ac_counter_vs));\n}"
             ,0x8f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_198);
  std::ios_base::~ios_base((ios_base *)(auStack_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GenVSSrc(int binding, int offset)
	{
		std::ostringstream os;
		os << "#version 310 es" NL "layout(location = 0) in vec4 i_vertex;" NL "flat out uvec4 o_atomic_value;" NL
			  "layout(binding = "
		   << binding << ", offset = " << offset
		   << ") uniform atomic_uint ac_counter_vs;" NL "void main() {" NL "  gl_Position = i_vertex;" NL
			  "  o_atomic_value = uvec4(atomicCounterIncrement(ac_counter_vs));" NL "}";
		return os.str();
	}